

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Tuple4(Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e0,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e1,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e2,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e3)

{
  pointer pcVar1;
  
  (this->a)._M_dataplus._M_p = (pointer)&(this->a).field_2;
  pcVar1 = (e0->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + e0->_M_string_length);
  (this->b)._M_dataplus._M_p = (pointer)&(this->b).field_2;
  pcVar1 = (e1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&this->b,pcVar1,pcVar1 + e1->_M_string_length)
  ;
  (this->c)._M_dataplus._M_p = (pointer)&(this->c).field_2;
  pcVar1 = (e2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&this->c,pcVar1,pcVar1 + e2->_M_string_length)
  ;
  (this->d)._M_dataplus._M_p = (pointer)&(this->d).field_2;
  pcVar1 = (e3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&this->d,pcVar1,pcVar1 + e3->_M_string_length)
  ;
  return;
}

Assistant:

explicit Tuple4 (const T0& e0 = T0(),
					 const T1& e1 = T1(),
					 const T2& e2 = T2(),
					 const T3& e3 = T3())
		: a	(e0)
		, b	(e1)
		, c	(e2)
		, d	(e3)
	{
	}